

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsCallbackFederateNextTimeCallback
               (HelicsFederate fed,_func_HelicsTime_HelicsTime_void_ptr *timeUpdate,void *userdata,
               HelicsError *err)

{
  CallbackFederate *nextTimeCallback;
  function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  *in_RDX;
  anon_class_16_2_a7e76f18 *in_RSI;
  CallbackFederate *fedptr;
  CallbackFederate *in_stack_ffffffffffffff90;
  CallbackFederate *this;
  HelicsError *in_stack_ffffffffffffffa0;
  HelicsFederate in_stack_ffffffffffffffa8;
  
  nextTimeCallback = getCallbackFed(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (nextTimeCallback != (CallbackFederate *)0x0) {
    if (in_RSI == (anon_class_16_2_a7e76f18 *)0x0) {
      helics::CallbackFederate::clearNextTimeCallback(in_stack_ffffffffffffff90);
    }
    else {
      this = (CallbackFederate *)&stack0xffffffffffffffa8;
      std::function<TimeRepresentation<count_time<9,long>>(TimeRepresentation<count_time<9,long>>)>
      ::function<helicsCallbackFederateNextTimeCallback::__0,void>(in_RDX,in_RSI);
      helics::CallbackFederate::setNextTimeCallback
                (this,(function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
                       *)nextTimeCallback);
      std::
      function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
      ::~function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
                   *)0x1bd9cd);
    }
  }
  return;
}

Assistant:

void helicsCallbackFederateNextTimeCallback(HelicsFederate fed,
                                            HelicsTime (*timeUpdate)(HelicsTime time, void* userdata),
                                            void* userdata,
                                            HelicsError* err)
{
    auto* fedptr = getCallbackFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (timeUpdate == nullptr) {
            fedptr->clearNextTimeCallback();
        } else {
            fedptr->setNextTimeCallback([timeUpdate, userdata](helics::Time newTime) { return timeUpdate(newTime, userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}